

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_movem_32_er_aw(void)

{
  uint uVar1;
  uint uVar2;
  int local_18;
  uint local_14;
  uint count;
  uint ea;
  uint register_list;
  uint i;
  
  ea = 0;
  uVar1 = m68ki_read_imm_16();
  uVar2 = m68ki_read_imm_16();
  local_14 = (uint)(short)uVar2;
  local_18 = 0;
  for (; ea < 0x10; ea = ea + 1) {
    if ((uVar1 & 1 << ((byte)ea & 0x1f)) != 0) {
      uVar2 = m68ki_read_32_fc(local_14,m68ki_cpu.s_flag | m68ki_address_space);
      m68ki_cpu.dar[ea] = uVar2;
      local_14 = local_14 + 4;
      local_18 = local_18 + 1;
    }
  }
  m68ki_remaining_cycles =
       m68ki_remaining_cycles - (local_18 << ((byte)m68ki_cpu.cyc_movem_l & 0x1f));
  return;
}

Assistant:

static void m68k_op_movem_32_er_aw(void)
{
	uint i = 0;
	uint register_list = OPER_I_16();
	uint ea = EA_AW_32();
	uint count = 0;

	for(; i < 16; i++)
		if(register_list & (1 << i))
		{
			REG_DA[i] = m68ki_read_32(ea);
			ea += 4;
			count++;
		}

	USE_CYCLES(count<<CYC_MOVEM_L);
}